

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O3

pos_type gimage::anon_unknown_11::readPNMHeader
                   (char *name,int *ncomp,long *maxval,float *scale,long *width,long *height)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  _Alloc_hider _Var3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  IOException *pIVar7;
  long *plVar8;
  size_type *psVar9;
  istream *in_00;
  istream *extraout_RDX;
  istream *extraout_RDX_00;
  istream *extraout_RDX_01;
  istream *extraout_RDX_02;
  istream *extraout_RDX_03;
  istream *extraout_RDX_04;
  istream *extraout_RDX_05;
  istream *in_01;
  istream *piVar10;
  int iVar11;
  pos_type pVar12;
  string s;
  ostringstream ss;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  char *local_3f8;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0 [11];
  long local_238 [3];
  undefined4 auStack_21c [123];
  
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_238);
  lVar5 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar5) = 7;
  std::ios::clear((int)&local_418 + (int)lVar5 + 0x1e0);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)name);
  local_3f8 = name;
  (anonymous_namespace)::readPNMToken_abi_cxx11_(local_3b0,(_anonymous_namespace_ *)local_238,in_00)
  ;
  std::__cxx11::string::operator=((string *)&local_418,(string *)local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
    operator_delete(local_3b0[0]._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_418);
  iVar11 = 1;
  piVar10 = extraout_RDX;
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)&local_418);
    piVar10 = extraout_RDX_00;
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_418);
      iVar11 = 3;
      piVar10 = extraout_RDX_01;
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_418);
        piVar10 = extraout_RDX_02;
        if (iVar4 != 0) {
          pIVar7 = (IOException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_3d0,"Unknown PNM image type \'",&local_418);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_3d0);
          local_3f0._M_dataplus._M_p = (pointer)*plVar8;
          psVar9 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_3f0._M_dataplus._M_p == psVar9) {
            local_3f0.field_2._M_allocated_capacity = *psVar9;
            local_3f0.field_2._8_8_ = plVar8[3];
            local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
          }
          else {
            local_3f0.field_2._M_allocated_capacity = *psVar9;
          }
          local_3f0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_3f0);
          local_3b0[0]._M_dataplus._M_p = (pointer)*plVar8;
          psVar9 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_3b0[0]._M_dataplus._M_p == psVar9) {
            local_3b0[0].field_2._0_8_ = *psVar9;
            local_3b0[0].field_2._8_8_ = plVar8[3];
            local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
          }
          else {
            local_3b0[0].field_2._0_8_ = *psVar9;
          }
          local_3b0[0]._M_string_length = plVar8[1];
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          gutil::IOException::IOException(pIVar7,local_3b0);
          __cxa_throw(pIVar7,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
      }
    }
  }
  *ncomp = iVar11;
  (anonymous_namespace)::readPNMToken_abi_cxx11_
            (local_3b0,(_anonymous_namespace_ *)local_238,piVar10);
  _Var3._M_p = local_3b0[0]._M_dataplus._M_p;
  lVar5 = atol(local_3b0[0]._M_dataplus._M_p);
  *width = lVar5;
  paVar1 = &local_3b0[0].field_2;
  piVar10 = extraout_RDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p);
    piVar10 = extraout_RDX_04;
  }
  (anonymous_namespace)::readPNMToken_abi_cxx11_
            (local_3b0,(_anonymous_namespace_ *)local_238,piVar10);
  _Var3._M_p = local_3b0[0]._M_dataplus._M_p;
  lVar5 = atol(local_3b0[0]._M_dataplus._M_p);
  *height = lVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p);
  }
  *maxval = 0;
  *scale = 0.0;
  iVar4 = std::__cxx11::string::compare((char *)&local_418);
  piVar10 = extraout_RDX_05;
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)&local_418);
    piVar10 = in_01;
    if (iVar4 != 0) {
      (anonymous_namespace)::readPNMToken_abi_cxx11_
                (local_3b0,(_anonymous_namespace_ *)local_238,in_01);
      lVar5 = atol(local_3b0[0]._M_dataplus._M_p);
      *maxval = lVar5;
      goto LAB_001386c4;
    }
  }
  (anonymous_namespace)::readPNMToken_abi_cxx11_
            (local_3b0,(_anonymous_namespace_ *)local_238,piVar10);
  dVar2 = atof(local_3b0[0]._M_dataplus._M_p);
  *scale = (float)dVar2;
LAB_001386c4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b0[0]._M_dataplus._M_p);
  }
  if (((*width != 0) && (*height != 0)) && ((*maxval != 0 || ((*scale != 0.0 || (NAN(*scale))))))) {
    pVar12 = (pos_type)std::istream::tellg();
    std::ifstream::close();
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p);
    }
    return pVar12;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Invalid PNM image (",0x13);
  poVar6 = std::ostream::_M_insert<long>((long)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  std::ostream::_M_insert<long>((long)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0," ",1);
  poVar6 = std::ostream::_M_insert<double>((double)*scale);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") of image ",0xb);
  std::operator<<(poVar6,local_3f8);
  pIVar7 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  gutil::IOException::IOException(pIVar7,&local_3f0);
  __cxa_throw(pIVar7,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

std::istream::pos_type readPNMHeader(const char *name, int &ncomp, long &maxval,
                                     float &scale, long &width, long &height)
{
  std::string            s;
  std::istream::pos_type ret=0;

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    s=readPNMToken(in);

    if (s == "P5" || s == "Pf")
    {
      ncomp=1;
    }
    else if (s == "P6" || s == "PF")
    {
      ncomp=3;
    }
    else
    {
      throw gutil::IOException("Unknown PNM image type '"+s+"' of image "+name);
    }

    width=atol(readPNMToken(in).c_str());
    height=atol(readPNMToken(in).c_str());

    maxval=0;
    scale=0;

    if (s == "Pf" || s == "PF")
    {
      scale=static_cast<float>(atof(readPNMToken(in).c_str()));
    }
    else
    {
      maxval=atol(readPNMToken(in).c_str());
    }

    if (width == 0 || height == 0 || (maxval == 0 && scale== 0))
    {
      std::ostringstream ss;
      ss << "Invalid PNM image (" << width << " " << height << " " << maxval;
      ss << " " << scale << ") of image " << name;
      throw gutil::IOException(ss.str());
    }

    ret=in.tellg();
    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }

  return ret;
}